

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

String __thiscall testing::internal::CapturedStream::GetCapturedString(CapturedStream *this)

{
  char *path;
  FILE *file_00;
  size_t extraout_RDX;
  int *in_RSI;
  String SVar1;
  CapturedStream *this_00;
  FILE *file;
  CapturedStream *this_local;
  String *content;
  
  this_00 = this;
  if (in_RSI[1] != -1) {
    fflush((FILE *)0x0);
    dup2(in_RSI[1],*in_RSI);
    close(in_RSI[1]);
    in_RSI[1] = -1;
  }
  path = (char *)std::__cxx11::string::c_str();
  file_00 = posix::FOpen(path,"r");
  ReadEntireFile(this_00,file_00);
  posix::FClose(file_00);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

String GetCapturedString() {
    if (uncaptured_fd_ != -1) {
      // Restores the original stream.
      fflush(NULL);
      dup2(uncaptured_fd_, fd_);
      close(uncaptured_fd_);
      uncaptured_fd_ = -1;
    }

    FILE* const file = posix::FOpen(filename_.c_str(), "r");
    const String content = ReadEntireFile(file);
    posix::FClose(file);
    return content;
  }